

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonStringReset(JsonString *p)

{
  JsonString *p_local;
  
  if (p->bStatic == '\0') {
    sqlite3RCStrUnref(p->zBuf);
  }
  jsonStringZero(p);
  return;
}

Assistant:

static void jsonStringReset(JsonString *p){
  if( !p->bStatic ) sqlite3RCStrUnref(p->zBuf);
  jsonStringZero(p);
}